

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark_branchfree.cpp
# Opt level: O0

result_t benchmark_sum_dividers<unsigned_int,std::vector<unsigned_int,std::allocator<unsigned_int>>>
                   (vector<unsigned_int,_std::allocator<unsigned_int>_> *dividers,size_t iters)

{
  result_t rVar1;
  uint numerator_00;
  uint *puVar2;
  size_t sVar3;
  type __d;
  long in_RSI;
  rep_conflict rVar4;
  duration<double,_std::ratio<1L,_1L>_> seconds;
  time_point t2;
  uint numerator;
  size_t sum;
  time_point t1;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  *in_stack_ffffffffffffffa0;
  duration<double,_std::ratio<1L,_1L>_> *this;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  *in_stack_ffffffffffffffa8;
  duration<double,_std::ratio<1L,_1L>_> in_stack_ffffffffffffffb0;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_ffffffffffffffb8;
  uint local_38;
  uint local_34;
  size_t local_30;
  undefined8 local_28;
  long local_20;
  
  local_20 = in_RSI;
  local_28 = std::chrono::_V2::system_clock::now();
  local_30 = 0;
  for (; local_20 != 0; local_20 = local_20 + -1) {
    local_38 = 2;
    numerator_00 = (uint)local_20;
    puVar2 = std::max<unsigned_int>(&local_38,(uint *)&stack0xffffffffffffffc4);
    local_34 = *puVar2;
    sVar3 = sum_dividers<unsigned_int,std::vector<unsigned_int,std::allocator<unsigned_int>>>
                      (numerator_00,in_stack_ffffffffffffffb8);
    local_30 = sVar3 + local_30;
  }
  std::chrono::_V2::system_clock::now();
  __d = std::chrono::operator-(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
  this = (duration<double,_std::ratio<1L,_1L>_> *)&stack0xffffffffffffffb0;
  std::chrono::duration<double,std::ratio<1l,1l>>::duration<long,std::ratio<1l,1000000000l>,void>
            ((duration<double,_std::ratio<1L,_1L>_> *)in_stack_ffffffffffffffb0.__r,
             (duration<long,_std::ratio<1L,_1000000000L>_> *)__d.__r);
  rVar4 = std::chrono::duration<double,_std::ratio<1L,_1L>_>::count(this);
  rVar1.sum = local_30;
  rVar1.duration = rVar4;
  return rVar1;
}

Assistant:

NOINLINE result_t benchmark_sum_dividers(const D& dividers, size_t iters) {
    auto t1 = std::chrono::system_clock::now();
    size_t sum = 0;

    for (; iters > 0; iters--) {
        // Unsigned branchfree divider cannot be 1
        T numerator = std::max((T)2, (T)iters);
        sum += sum_dividers(numerator, dividers);
    }

    auto t2 = std::chrono::system_clock::now();
    std::chrono::duration<double> seconds = t2 - t1;
    return result_t{seconds.count(), sum};
}